

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
* __thiscall
Graph<unsigned_long,_scc::VectorType>::dual_dfs
          (vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
           *__return_storage_ptr__,Graph<unsigned_long,_scc::VectorType> *this)

{
  bool bVar1;
  reference pNVar2;
  Node *pNVar3;
  Node *i_1;
  iterator __end0_1;
  iterator __begin0_1;
  Container *__range2_1;
  Node *i;
  iterator __end0;
  iterator __begin0;
  Container *__range2;
  Graph<unsigned_long,_scc::VectorType> *this_local;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *ordered_nodes;
  
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::vector(__return_storage_ptr__);
  __end0 = std::
           vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
           ::begin(&this->nodes);
  i = (Node *)std::
              vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
              ::end(&this->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
                                     *)&i), bVar1) {
    pNVar2 = __gnu_cxx::
             __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
             ::operator*(&__end0);
    pNVar3 = ::scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
             get<Graph<unsigned_long,scc::VectorType>::Node>(pNVar2);
    Node::dual_dfs(pNVar3,__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
    ::operator++(&__end0);
  }
  __end0_1 = std::
             vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             ::begin(&this->nodes);
  i_1 = (Node *)std::
                vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
                ::end(&this->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
                             *)&i_1), bVar1) {
    pNVar2 = __gnu_cxx::
             __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
             ::operator*(&__end0_1);
    pNVar3 = ::scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
             get<Graph<unsigned_long,scc::VectorType>::Node>(pNVar2);
    pNVar3->visited = false;
    __gnu_cxx::
    __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
    ::operator++(&__end0_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Node *> dual_dfs() {
        std::vector<const Node *> ordered_nodes{};
        for (auto &i: nodes) {
            TypeImpl::get(i).dual_dfs(ordered_nodes);
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return ordered_nodes;
    }